

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_KEY * o2i_ECPublicKey(EC_KEY **key,uchar **in,long len)

{
  int iVar1;
  EC_POINT *pEVar2;
  EC_KEY *ret;
  long len_local;
  uint8_t **inp_local;
  EC_KEY **keyp_local;
  
  if (((key == (EC_KEY **)0x0) || (*key == (EC_KEY *)0x0)) || (*(long *)*key == 0)) {
    ERR_put_error(0xf,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x1fc);
    keyp_local = (EC_KEY **)0x0;
  }
  else {
    keyp_local = (EC_KEY **)*key;
    if (*(long *)((long)keyp_local + 8) == 0) {
      pEVar2 = EC_POINT_new((EC_GROUP *)*keyp_local);
      *(EC_POINT **)((long)keyp_local + 8) = pEVar2;
      if (pEVar2 == (EC_POINT *)0x0) {
        return (EC_KEY *)0x0;
      }
    }
    iVar1 = EC_POINT_oct2point((EC_GROUP *)*keyp_local,*(EC_POINT **)((long)keyp_local + 8),*in,len,
                               (BN_CTX *)0x0);
    if (iVar1 == 0) {
      ERR_put_error(0xf,0,0xf,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,0x205);
      keyp_local = (EC_KEY **)0x0;
    }
    else {
      *(uint *)((long)keyp_local + 0x1c) = **in & 0xfffffffe;
      *in = *in + len;
    }
  }
  return (EC_KEY *)keyp_local;
}

Assistant:

EC_KEY *o2i_ECPublicKey(EC_KEY **keyp, const uint8_t **inp, long len) {
  EC_KEY *ret = NULL;

  if (keyp == NULL || *keyp == NULL || (*keyp)->group == NULL) {
    OPENSSL_PUT_ERROR(EC, ERR_R_PASSED_NULL_PARAMETER);
    return NULL;
  }
  ret = *keyp;
  if (ret->pub_key == NULL &&
      (ret->pub_key = EC_POINT_new(ret->group)) == NULL) {
    return NULL;
  }
  if (!EC_POINT_oct2point(ret->group, ret->pub_key, *inp, len, NULL)) {
    OPENSSL_PUT_ERROR(EC, ERR_R_EC_LIB);
    return NULL;
  }
  // save the point conversion form
  ret->conv_form = (point_conversion_form_t)(*inp[0] & ~0x01);
  *inp += len;
  return ret;
}